

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall embree::XMLWriter::store(XMLWriter *this,TriangleLight *light,ssize_t id)

{
  vfloat4 a0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"TriangleLight","");
  open(this,(char *)local_88,(int)id);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  local_38 = (light->v2).field_0.m128[0];
  fStack_34 = (light->v2).field_0.m128[1];
  fStack_30 = (light->v2).field_0.m128[2];
  fStack_2c = (light->v2).field_0.m128[3];
  local_68.m128[0] = (light->v0).field_0.m128[0] - local_38;
  local_68.m128[1] = (light->v0).field_0.m128[1] - fStack_34;
  local_68.m128[2] = (light->v0).field_0.m128[2] - fStack_30;
  local_68.m128[3] = (light->v0).field_0.m128[3] - fStack_2c;
  local_58 = (light->v1).field_0.m128[0] - local_38;
  fStack_54 = (light->v1).field_0.m128[1] - fStack_34;
  fStack_50 = (light->v1).field_0.m128[2] - fStack_30;
  fStack_4c = (light->v1).field_0.m128[3] - fStack_2c;
  fStack_40 = fStack_54 * local_68.m128[0] - local_68.m128[1] * local_58;
  local_48 = fStack_50 * local_68.m128[1] - local_68.m128[2] * fStack_54;
  fStack_44 = local_58 * local_68.m128[2] - local_68.m128[0] * fStack_50;
  fStack_3c = fStack_4c * local_68.m128[3] - local_68.m128[3] * fStack_4c;
  store(this,"AffineSpace",(AffineSpace3fa *)&local_68.field_1);
  store(this,"L",&light->L);
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"TriangleLight","");
  close(this,(int)local_a8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  return;
}

Assistant:

void XMLWriter::store(const SceneGraph::TriangleLight& light, ssize_t id)
  {
    open("TriangleLight",id);
    const Vec3fa dx = light.v0-light.v2;
    const Vec3fa dy = light.v1-light.v2;
    const Vec3fa dz = cross(dx,dy);
    const Vec3fa p = light.v2;
    store("AffineSpace",AffineSpace3fa(dx,dy,dz,p));
    store("L",light.L);
    close("TriangleLight");
  }